

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O0

void jpc_mqenc_setctxs(jpc_mqenc_t *mqenc,int numctxs,jpc_mqctx_t *ctxs)

{
  int local_30;
  int local_2c;
  jpc_mqstate_t **ppjStack_28;
  int n;
  jpc_mqstate_t **ctx;
  jpc_mqctx_t *ctxs_local;
  int numctxs_local;
  jpc_mqenc_t *mqenc_local;
  
  ppjStack_28 = mqenc->ctxs;
  local_30 = numctxs;
  if (mqenc->maxctxs < numctxs) {
    local_30 = mqenc->maxctxs;
  }
  local_2c = local_30;
  ctx = (jpc_mqstate_t **)ctxs;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    *ppjStack_28 = jpc_mqstates + (long)ctx[1] * 2 + (ulong)(*(byte *)ctx & 1);
    ppjStack_28 = ppjStack_28 + 1;
    ctx = ctx + 2;
  }
  local_2c = mqenc->maxctxs - numctxs;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    *ppjStack_28 = jpc_mqstates;
    ppjStack_28 = ppjStack_28 + 1;
  }
  return;
}

Assistant:

void jpc_mqenc_setctxs(jpc_mqenc_t *mqenc, int numctxs, const jpc_mqctx_t *ctxs)
{
	const jpc_mqstate_t **ctx;
	int n;

	ctx = mqenc->ctxs;
	n = JAS_MIN(mqenc->maxctxs, numctxs);
	while (--n >= 0) {
		*ctx = &jpc_mqstates[2 * ctxs->ind + ctxs->mps];
		++ctx;
		++ctxs;
	}
	n = mqenc->maxctxs - numctxs;
	while (--n >= 0) {
		*ctx = &jpc_mqstates[0];
		++ctx;
	}

}